

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O1

DdNode * cuddBddXorRecur(DdManager *manager,DdNode *f,DdNode *g)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  DdNode *g_00;
  DdNode *pDVar4;
  uint *puVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint index;
  DdNode *pDVar8;
  DdNode *f_00;
  
  pDVar4 = manager->one;
  if (f == g) {
    return (DdNode *)((ulong)pDVar4 ^ 1);
  }
  if ((DdNode *)((ulong)g ^ 1) == f) {
    return pDVar4;
  }
  pDVar6 = f;
  if ((long)((ulong)((uint)g & 1) + *(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2) <
      (long)((ulong)((uint)f & 1) + *(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2)) {
    pDVar6 = g;
    g = f;
  }
  if (g == (DdNode *)((ulong)pDVar4 ^ 1)) {
    return pDVar6;
  }
  if (g == pDVar4) {
    return (DdNode *)((ulong)pDVar6 ^ 1);
  }
  f_00 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
  g_00 = (DdNode *)((ulong)g ^ 1);
  if (((ulong)pDVar6 & 1) == 0) {
    f_00 = pDVar6;
    g_00 = g;
  }
  if (f_00 == pDVar4) {
    return (DdNode *)((ulong)g_00 ^ 1);
  }
  pDVar4 = cuddCacheLookup2(manager,Cudd_bddXor,f_00,g_00);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  uVar2 = manager->perm[f_00->index];
  puVar5 = (uint *)((ulong)g_00 & 0xfffffffffffffffe);
  uVar3 = manager->perm[*puVar5];
  pDVar4 = f_00;
  pDVar6 = f_00;
  index = *puVar5;
  if (uVar2 <= uVar3) {
    pDVar4 = (f_00->type).kids.T;
    pDVar6 = (f_00->type).kids.E;
    index = f_00->index;
  }
  pDVar7 = g_00;
  pDVar8 = g_00;
  if (uVar3 <= uVar2) {
    pDVar7 = *(DdNode **)(puVar5 + 4);
    pDVar8 = *(DdNode **)(puVar5 + 6);
    if (((ulong)g_00 & 1) != 0) {
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
      pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
    }
  }
  pDVar4 = cuddBddXorRecur(manager,pDVar4,pDVar7);
  if (pDVar4 != (DdNode *)0x0) {
    pDVar7 = (DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe);
    pDVar7->ref = pDVar7->ref + 1;
    pDVar6 = cuddBddXorRecur(manager,pDVar6,pDVar8);
    if (pDVar6 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar8 = pDVar4;
      if (pDVar4 == pDVar6) {
LAB_007ea300:
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        pDVar7->ref = pDVar7->ref - 1;
        cuddCacheInsert2(manager,Cudd_bddXor,f_00,g_00,pDVar8);
        return pDVar8;
      }
      if (((ulong)pDVar4 & 1) == 0) {
        pDVar8 = cuddUniqueInter(manager,index,pDVar4,pDVar6);
        if (pDVar8 != (DdNode *)0x0) goto LAB_007ea300;
      }
      else {
        pDVar8 = cuddUniqueInter(manager,index,pDVar7,(DdNode *)((ulong)pDVar6 ^ 1));
        if (pDVar8 != (DdNode *)0x0) {
          pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
          goto LAB_007ea300;
        }
      }
      Cudd_IterDerefBdd(manager,pDVar4);
      pDVar4 = pDVar6;
    }
    Cudd_IterDerefBdd(manager,pDVar4);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddXorRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{
    DdNode *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == g) return(zero);
    if (f == Cudd_Not(g)) return(one);
    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency and simplify tests. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }
    if (g == zero) return(f);
    if (g == one) return(Cudd_Not(f));
    if (Cudd_IsComplement(f)) {
        f = Cudd_Not(f);
        g = Cudd_Not(g);
    }
    /* Now the first argument is regular. */
    if (f == one) return(Cudd_Not(g));

    /* At this point f and g are not constant. */

    /* Check cache. */
    r = cuddCacheLookup2(manager, Cudd_bddXor, f, g);
    if (r != NULL) return(r);

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    topf = manager->perm[f->index];
    G = Cudd_Regular(g);
    topg = manager->perm[G->index];

    /* Compute cofactors. */
    if (topf <= topg) {
        index = f->index;
        fv = cuddT(f);
        fnv = cuddE(f);
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg <= topf) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    t = cuddBddXorRecur(manager, fv, gv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddXorRecur(manager, fnv, gnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (t == e) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
    }
    cuddDeref(e);
    cuddDeref(t);
    cuddCacheInsert2(manager, Cudd_bddXor, f, g, r);
    return(r);

}